

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  u32 uVar1;
  sqlite3 *db;
  Table *pTVar2;
  Schema *pSVar3;
  char *pcVar4;
  Column *pCVar5;
  Expr *pEVar6;
  char *__src;
  byte bVar7;
  int iVar8;
  Table *pTVar9;
  ulong __n;
  byte *__dest;
  Vdbe *p;
  uint uVar10;
  Schema **ppSVar11;
  int p1;
  Expr *pExpr;
  char *pcVar12;
  byte *pbVar13;
  long lVar14;
  sqlite3_value *pVal;
  
  if ((pParse->nErr == 0) && (db = pParse->db, db->mallocFailed == '\0')) {
    pTVar2 = pParse->pNewTable;
    if (pTVar2->pSchema == (Schema *)0x0) {
      p1 = -1000000;
    }
    else {
      p1 = -1;
      ppSVar11 = &db->aDb->pSchema;
      do {
        p1 = p1 + 1;
        pSVar3 = *ppSVar11;
        ppSVar11 = ppSVar11 + 4;
      } while (pSVar3 != pTVar2->pSchema);
    }
    pcVar12 = db->aDb[p1].zDbSName;
    pcVar4 = pTVar2->zName;
    pCVar5 = pTVar2->aCol;
    lVar14 = (long)pTVar2->nCol;
    pEVar6 = pCVar5[lVar14 + -1].pDflt;
    pTVar9 = sqlite3FindTable(db,pcVar4 + 0x10,pcVar12);
    iVar8 = sqlite3AuthCheck(pParse,0x1a,pcVar12,pTVar9->zName,(char *)0x0);
    if (iVar8 == 0) {
      if (pEVar6 == (Expr *)0x0) {
        pExpr = (Expr *)0x0;
      }
      else {
        pExpr = (Expr *)0x0;
        if (pEVar6->pLeft->op != 'r') {
          pExpr = pEVar6;
        }
      }
      if ((pCVar5[lVar14 + -1].colFlags & 1) == 0) {
        if (pTVar2->pIndex == (Index *)0x0) {
          if ((((db->flags & 0x4000) == 0) || (pTVar2->pFKey == (FKey *)0x0)) ||
             (pExpr == (Expr *)0x0)) {
            if ((pCVar5[lVar14 + -1].notNull == '\0') || (pExpr != (Expr *)0x0)) {
              if (pExpr != (Expr *)0x0) {
                pVal = (sqlite3_value *)0x0;
                iVar8 = valueFromExpr(db,pExpr,'\x01','A',&pVal,(ValueNewStat4Ctx *)0x0);
                if (iVar8 != 0) {
                  return;
                }
                if (pVal == (sqlite3_value *)0x0) {
                  sqlite3ErrorMsg(pParse,"Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree(pVal);
              }
              __src = pColDef->z;
              if (__src == (char *)0x0) {
                __dest = (byte *)0x0;
              }
              else {
                __n = (ulong)pColDef->n;
                __dest = (byte *)sqlite3DbMallocRawNN(db,__n + 1);
                if (__dest != (byte *)0x0) {
                  memcpy(__dest,__src,__n);
                  __dest[__n] = 0;
                }
              }
              if (__dest != (byte *)0x0) {
                uVar1 = db->mDbFlags;
                uVar10 = pColDef->n - 1;
                if (uVar10 != 0) {
                  pbVar13 = __dest + uVar10;
                  do {
                    if (((ulong)*pbVar13 != 0x3b) && ((""[*pbVar13] & 1) == 0)) break;
                    *pbVar13 = 0;
                    pbVar13 = pbVar13 + -1;
                  } while (__dest < pbVar13);
                }
                *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 2;
                sqlite3NestedParse(pParse,
                                   "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                   ,pcVar12,"sqlite_master",(ulong)(uint)pTVar2->addColOffset,__dest
                                   ,(ulong)(pTVar2->addColOffset + 1),pcVar4 + 0x10);
                sqlite3DbFreeNN(db,__dest);
                db->mDbFlags = uVar1;
              }
              p = sqlite3GetVdbe(pParse);
              if (p != (Vdbe *)0x0) {
                if (pParse->nTempReg == '\0') {
                  iVar8 = pParse->nMem + 1;
                  pParse->nMem = iVar8;
                }
                else {
                  bVar7 = pParse->nTempReg - 1;
                  pParse->nTempReg = bVar7;
                  iVar8 = pParse->aTempReg[bVar7];
                }
                sqlite3VdbeAddOp3(p,0x5e,p1,iVar8,2);
                sqlite3VdbeUsesBtree(p,p1);
                sqlite3VdbeAddOp3(p,0x53,iVar8,-2,0);
                sqlite3VdbeAddOp3(p,0x2f,iVar8,p->nOp + 2,0);
                sqlite3VdbeAddOp3(p,0x5f,p1,2,3);
                if (iVar8 != 0) {
                  bVar7 = pParse->nTempReg;
                  if ((ulong)bVar7 < 8) {
                    pParse->nTempReg = bVar7 + 1;
                    pParse->aTempReg[bVar7] = iVar8;
                  }
                }
              }
              renameReloadSchema(pParse,p1);
              return;
            }
            pcVar12 = "Cannot add a NOT NULL column with default value NULL";
          }
          else {
            pcVar12 = "Cannot add a REFERENCES column with non-NULL default value";
          }
        }
        else {
          pcVar12 = "Cannot add a UNIQUE column";
        }
      }
      else {
        pcVar12 = "Cannot add a PRIMARY KEY column";
      }
      sqlite3ErrorMsg(pParse,pcVar12);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */
  Vdbe *v;                  /* The prepared statement under construction */
  int r1;                   /* Temporary registers */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zDbSName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  assert( pDflt==0 || pDflt->op==TK_SPAN );
  if( pDflt && pDflt->pLeft->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal = 0;
    int rc;
    rc = sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_BLOB, &pVal);
    assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
    if( rc!=SQLITE_OK ){
      assert( db->mallocFailed == 1 );
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    u32 savedDbFlags = db->mDbFlags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->mDbFlags |= DBFLAG_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, MASTER_NAME, pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->mDbFlags = savedDbFlags;
  }

  /* Make sure the schema version is at least 3.  But do not upgrade
  ** from less than 3 to 4, as that will corrupt any preexisting DESC
  ** index.
  */
  v = sqlite3GetVdbe(pParse);
  if( v ){
    r1 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, r1, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    sqlite3VdbeAddOp2(v, OP_AddImm, r1, -2);
    sqlite3VdbeAddOp2(v, OP_IfPos, r1, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, 3);
    sqlite3ReleaseTempReg(pParse, r1);
  }

  /* Reload the table definition */
  renameReloadSchema(pParse, iDb);
}